

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.cpp
# Opt level: O0

void __thiscall adios2::format::BPBase::BPBase(BPBase *this,Comm *comm)

{
  int iVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  BufferSTL *in_stack_ffffffffffffffc0;
  
  *in_RDI = &PTR__BPBase_0112dc10;
  in_RDI[1] = in_RSI;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined4 *)((long)in_RDI + 0x14) = 1;
  *(undefined4 *)(in_RDI + 3) = 1;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  BufferSTL::BufferSTL(in_stack_ffffffffffffffc0);
  BufferSTL::BufferSTL(in_stack_ffffffffffffffc0);
  MetadataSet::MetadataSet
            ((MetadataSet *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  Parameters::Parameters
            ((Parameters *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  *(undefined1 *)(in_RDI + 0x4e) = 0;
  profiling::IOChrono::IOChrono
            ((IOChrono *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  *(undefined1 *)(in_RDI + 0x5e) = 1;
  *(undefined1 *)((long)in_RDI + 0x2f1) = 0;
  aggregator::MPIChain::MPIChain
            ((MPIChain *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0xadf6ea);
  in_RDI[0x73] = 0;
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0xadf70b);
  std::
  map<unsigned_long,_std::map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>_>_>_>
  ::map((map<unsigned_long,_std::map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>_>_>_>
         *)0xadf721);
  iVar1 = helper::Comm::Rank((Comm *)0xadf72f);
  *(int *)(in_RDI + 2) = iVar1;
  iVar1 = helper::Comm::Size((Comm *)0xadf74a);
  *(int *)((long)in_RDI + 0x14) = iVar1;
  *(undefined1 *)(in_RDI + 0x5d) = 1;
  return;
}

Assistant:

BPBase::BPBase(helper::Comm const &comm) : m_Comm(comm)
{
    m_RankMPI = m_Comm.Rank();
    m_SizeMPI = m_Comm.Size();
    m_Profiler.m_IsActive = true; // default
}